

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_centroid(REF_NODE ref_node,REF_INT *nodes,REF_DBL *centroid)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *centroid_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if ((((((*nodes < 0) || (ref_node->max <= *nodes)) || (ref_node->global[*nodes] < 0)) ||
       ((nodes[1] < 0 || (ref_node->max <= nodes[1])))) ||
      ((ref_node->global[nodes[1]] < 0 || ((nodes[2] < 0 || (ref_node->max <= nodes[2])))))) ||
     (ref_node->global[nodes[2]] < 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8e7,
           "ref_node_tri_centroid",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    *centroid = (ref_node->real[*nodes * 0xf] + ref_node->real[nodes[1] * 0xf] +
                ref_node->real[nodes[2] * 0xf]) / 3.0;
    centroid[1] = (ref_node->real[*nodes * 0xf + 1] + ref_node->real[nodes[1] * 0xf + 1] +
                  ref_node->real[nodes[2] * 0xf + 1]) / 3.0;
    centroid[2] = (ref_node->real[*nodes * 0xf + 2] + ref_node->real[nodes[1] * 0xf + 2] +
                  ref_node->real[nodes[2] * 0xf + 2]) / 3.0;
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_centroid(REF_NODE ref_node, REF_INT *nodes,
                                         REF_DBL *centroid) {
  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  centroid[0] = (ref_node_xyz(ref_node, 0, nodes[0]) +
                 ref_node_xyz(ref_node, 0, nodes[1]) +
                 ref_node_xyz(ref_node, 0, nodes[2])) /
                3.0;
  centroid[1] = (ref_node_xyz(ref_node, 1, nodes[0]) +
                 ref_node_xyz(ref_node, 1, nodes[1]) +
                 ref_node_xyz(ref_node, 1, nodes[2])) /
                3.0;
  centroid[2] = (ref_node_xyz(ref_node, 2, nodes[0]) +
                 ref_node_xyz(ref_node, 2, nodes[1]) +
                 ref_node_xyz(ref_node, 2, nodes[2])) /
                3.0;

  return REF_SUCCESS;
}